

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curve_geometry_device.cpp
# Opt level: O0

Vec3fa __thiscall embree::interpolate_linear(embree *this,TutorialData *data,uint primID,float u)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  float fVar5;
  Vec3fa VVar6;
  float fStack_68;
  float fStack_64;
  Vec3fa c1;
  Vec3fa c0;
  float u_local;
  uint primID_local;
  TutorialData *data_local;
  
  uVar1 = *(undefined8 *)&data->hair_vertex_colors[primID + 1].field_0;
  uVar2 = *(undefined8 *)((long)&data->hair_vertex_colors[primID + 1].field_0 + 8);
  uVar3 = *(undefined8 *)&data->hair_vertex_colors[primID + 2].field_0;
  uVar4 = *(undefined8 *)((long)&data->hair_vertex_colors[primID + 2].field_0 + 8);
  fVar5 = 1.0 - u;
  c0.field_0.m128[2] = (float)uVar1;
  c0.field_0.m128[3] = (float)((ulong)uVar1 >> 0x20);
  u_local = (float)uVar2;
  primID_local = (uint)((ulong)uVar2 >> 0x20);
  VVar6.field_0.m128[3] = c0.field_0.m128[3] * fVar5;
  VVar6.field_0.m128[2] = c0.field_0.m128[2] * fVar5;
  fStack_68 = (float)uVar3;
  fStack_64 = (float)((ulong)uVar3 >> 0x20);
  c1.field_0.m128[0] = (float)uVar4;
  c1.field_0.m128[1] = (float)((ulong)uVar4 >> 0x20);
  uVar1 = CONCAT44(c0.field_0.m128[3] * fVar5 + fStack_64 * u,
                   c0.field_0.m128[2] * fVar5 + fStack_68 * u);
  *(undefined8 *)this = uVar1;
  *(ulong *)(this + 8) =
       CONCAT44((float)primID_local * fVar5 + c1.field_0.m128[1] * u,
                u_local * fVar5 + c1.field_0.m128[0] * u);
  VVar6.field_0._0_8_ = uVar1;
  return (Vec3fa)VVar6.field_0;
}

Assistant:

Vec3fa interpolate_linear(const TutorialData& data, unsigned int primID, float u)
{
  const Vec3fa c0 = ((Vec3fa*) data.hair_vertex_colors)[primID+1];
  const Vec3fa c1 = ((Vec3fa*) data.hair_vertex_colors)[primID+2];
  return Vec3fa(c0*(1.0f-u) + c1*u);
}